

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.h
# Opt level: O3

void __thiscall
aeron::archive::Configuration::Configuration(Configuration *this,Configuration *param_1)

{
  pointer pcVar1;
  bool bVar2;
  undefined3 uVar3;
  int32_t iVar4;
  int32_t iVar5;
  
  this->messageTimeoutNs = param_1->messageTimeoutNs;
  (this->controlChannel)._M_dataplus._M_p = (pointer)&(this->controlChannel).field_2;
  pcVar1 = (param_1->controlChannel)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->controlChannel,pcVar1,
             pcVar1 + (param_1->controlChannel)._M_string_length);
  this->controlStreamId = param_1->controlStreamId;
  (this->localControlChannel)._M_dataplus._M_p = (pointer)&(this->localControlChannel).field_2;
  pcVar1 = (param_1->localControlChannel)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->localControlChannel,pcVar1,
             pcVar1 + (param_1->localControlChannel)._M_string_length);
  this->localControlStreamId = param_1->localControlStreamId;
  (this->controlResponseChannel)._M_dataplus._M_p = (pointer)&(this->controlResponseChannel).field_2
  ;
  pcVar1 = (param_1->controlResponseChannel)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->controlResponseChannel,pcVar1,
             pcVar1 + (param_1->controlResponseChannel)._M_string_length);
  this->controlResponseStreamId = param_1->controlResponseStreamId;
  (this->recordingEventsChannel)._M_dataplus._M_p = (pointer)&(this->recordingEventsChannel).field_2
  ;
  pcVar1 = (param_1->recordingEventsChannel)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->recordingEventsChannel,pcVar1,
             pcVar1 + (param_1->recordingEventsChannel)._M_string_length);
  bVar2 = param_1->controlTermBufferSparse;
  uVar3 = *(undefined3 *)&param_1->field_0xa5;
  iVar4 = param_1->controlTermBufferLength;
  iVar5 = param_1->controlMtuLength;
  this->recordingEventsStreamId = param_1->recordingEventsStreamId;
  this->controlTermBufferSparse = bVar2;
  *(undefined3 *)&this->field_0xa5 = uVar3;
  this->controlTermBufferLength = iVar4;
  this->controlMtuLength = iVar5;
  return;
}

Assistant:

Configuration(const Configuration&) = default;